

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_script.cpp
# Opt level: O1

void __thiscall DFsScript::Destroy(DFsScript *this)

{
  ClearVariables(this,true);
  ClearSections(this);
  ClearChildren(this);
  (this->parent).field_0.p = (DFsScript *)0x0;
  if (this->data != (char *)0x0) {
    operator_delete__(this->data);
  }
  this->data = (char *)0x0;
  (this->parent).field_0.p = (DFsScript *)0x0;
  (this->trigger).field_0.p = (AActor *)0x0;
  DObject::Destroy(&this->super_DObject);
  return;
}

Assistant:

void DFsScript::Destroy()
{
	ClearVariables(true);
	ClearSections();
	ClearChildren();
	parent = NULL;
	if (data != NULL) delete [] data;
	data = NULL;
	parent = NULL;
	trigger = NULL;
	Super::Destroy();
}